

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O1

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  long lVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int i;
  ElementCount index;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  SegmentReader *in_stack_00000008;
  Fault f;
  long *in_stack_00000018;
  byte *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  uint in_stack_00000030;
  StructReader subStruct;
  Fault f_3;
  ListReader local_f8;
  uint local_bc;
  PointerReader local_b8;
  ListReader local_98;
  uint local_64;
  StructReader local_60;
  
  bVar11 = true;
  if (0x3f < in_stack_00000028) {
    bVar11 = *in_stack_00000018 != 0x1011121314151617;
  }
  if ((bVar11) && (kj::_::Debug::minSeverity < 3)) {
    local_98.segment = (SegmentReader *)0x1011121314151617;
    if (in_stack_00000028 < 0x40) {
      local_f8.segment = (SegmentReader *)0x0;
    }
    else {
      local_f8.segment = (SegmentReader *)*in_stack_00000018;
    }
    kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
               ,(char (*) [90])
                "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
               ,(unsigned_long_long *)&local_98,(unsigned_long *)&local_f8);
  }
  bVar11 = true;
  if (0x5f < in_stack_00000028) {
    bVar11 = (int)in_stack_00000018[1] != 0x20212223;
  }
  if ((bVar11) && (kj::_::Debug::minSeverity < 3)) {
    uVar4 = 0;
    local_98.segment = (SegmentReader *)CONCAT44(local_98.segment._4_4_,0x20212223);
    if (0x5f < in_stack_00000028) {
      uVar4 = (undefined4)in_stack_00000018[1];
    }
    local_f8.segment = (SegmentReader *)CONCAT44(local_f8.segment._4_4_,uVar4);
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xeb,ERROR,
               "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
               ,(char (*) [80])
                "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
               (uint *)&local_98,(uint *)&local_f8);
  }
  bVar11 = true;
  if (0x6f < in_stack_00000028) {
    bVar11 = *(short *)((long)in_stack_00000018 + 0xc) != 0x3031;
  }
  if ((bVar11) && (kj::_::Debug::minSeverity < 3)) {
    local_98.segment = (SegmentReader *)CONCAT44(local_98.segment._4_4_,0x3031);
    if (in_stack_00000028 < 0x70) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined2 *)((long)in_stack_00000018 + 0xc);
    }
    local_f8.segment = (SegmentReader *)CONCAT62(local_f8.segment._2_6_,uVar3);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
               (uint *)&local_98,(unsigned_short *)&local_f8);
  }
  bVar11 = true;
  if (0x77 < in_stack_00000028) {
    bVar11 = *(char *)((long)in_stack_00000018 + 0xe) != '@';
  }
  if ((bVar11) && (kj::_::Debug::minSeverity < 3)) {
    local_98.segment = (SegmentReader *)CONCAT44(local_98.segment._4_4_,0x40);
    if (in_stack_00000028 < 0x78) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(undefined1 *)((long)in_stack_00000018 + 0xe);
    }
    local_f8.segment = (SegmentReader *)CONCAT71(local_f8.segment._1_7_,uVar2);
    kj::_::Debug::log<char_const(&)[74],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
               ,(char (*) [74])
                "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
               (uint *)&local_98,(uchar *)&local_f8);
  }
  if (((0x78 < in_stack_00000028) && ((*(byte *)((long)in_stack_00000018 + 0xf) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xee,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\"",
               (char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))");
  }
  if (((0x79 < in_stack_00000028) && ((*(byte *)((long)in_stack_00000018 + 0xf) & 2) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xef,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\"",
               (char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))");
  }
  if (((in_stack_00000028 < 0x7b) || ((*(byte *)((long)in_stack_00000018 + 0xf) & 4) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf0,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\"",
               (char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)");
  }
  if (((0x7b < in_stack_00000028) && ((*(byte *)((long)in_stack_00000018 + 0xf) & 8) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf1,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\"",
               (char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))");
  }
  if (((in_stack_00000028 < 0x7d) || ((*(byte *)((long)in_stack_00000018 + 0xf) & 0x10) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf2,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\"",
               (char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)");
  }
  if (((in_stack_00000028 < 0x7e) || ((*(byte *)((long)in_stack_00000018 + 0xf) & 0x20) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf3,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\"",
               (char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)");
  }
  if (((in_stack_00000028 < 0x7f) || ((*(byte *)((long)in_stack_00000018 + 0xf) & 0x40) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf4,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\"",
               (char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)");
  }
  if (((0x7f < in_stack_00000028) && (*(char *)((long)in_stack_00000018 + 0xf) < '\0')) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xf5,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\"",
               (char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))");
  }
  if (in_stack_0000002c == 0) {
    local_f8.segment = (SegmentReader *)0x0;
    local_f8.capTable = (CapTableReader *)0x0;
    local_f8.ptr = (byte *)0x0;
    local_f8.elementCount = 0x7fffffff;
  }
  else {
    local_f8.segment = in_stack_00000008;
    local_f8.capTable = (CapTableReader *)f.exception;
    local_f8.ptr = in_stack_00000020;
    local_f8.elementCount = in_stack_00000030;
  }
  PointerReader::getStruct
            ((StructReader *)&local_98,(PointerReader *)&local_f8,
             (word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  bVar11 = true;
  if (0x1f < local_98.structDataSize) {
    bVar11 = *(int *)local_98.ptr != 0x7b;
  }
  if ((bVar11) && (kj::_::Debug::minSeverity < 3)) {
    iVar6 = 0;
    local_f8.segment = (SegmentReader *)CONCAT44(local_f8.segment._4_4_,0x7b);
    if (0x1f < local_98.structDataSize) {
      iVar6 = *(int *)local_98.ptr;
    }
    local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,iVar6);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xfa,ERROR,
               "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
               (uint *)&local_f8,(uint *)&local_60);
  }
  if (in_stack_0000002c < 2) {
    local_f8.segment = (SegmentReader *)0x0;
    local_f8.capTable = (CapTableReader *)0x0;
    local_f8.ptr = (byte *)0x0;
    local_f8.elementCount = 0x7fffffff;
  }
  else {
    local_f8.ptr = in_stack_00000020 + 8;
    local_f8.segment = in_stack_00000008;
    local_f8.capTable = (CapTableReader *)f.exception;
    local_f8.elementCount = in_stack_00000030;
  }
  PointerReader::getList(&local_98,(PointerReader *)&local_f8,FOUR_BYTES,(word *)0x0);
  if (local_98.elementCount != 3) {
    local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,3);
    local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,local_98.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())","3 * ELEMENTS, list.size()",
               (uint *)&local_60,(uint *)&local_b8);
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  }
  if ((*(int *)local_98.ptr != 200) && (kj::_::Debug::minSeverity < 3)) {
    local_f8.segment = (SegmentReader *)CONCAT44(local_f8.segment._4_4_,200);
    local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,*(int *)local_98.ptr);
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x100,ERROR,
               "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",
               (int *)&local_f8,(int *)&local_60);
  }
  if ((*(int *)((long)local_98.ptr + (ulong)(local_98.step >> 3)) != 0xc9) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_f8.segment = (SegmentReader *)CONCAT44(local_f8.segment._4_4_,0xc9);
    local_60.segment =
         (SegmentReader *)
         CONCAT44(local_60.segment._4_4_,
                  *(undefined4 *)((long)local_98.ptr + (ulong)(local_98.step >> 3)));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",
               (int *)&local_f8,(int *)&local_60);
  }
  if ((*(int *)((long)local_98.ptr + (ulong)(local_98.step >> 2)) != 0xca) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_f8.segment = (SegmentReader *)CONCAT44(local_f8.segment._4_4_,0xca);
    local_60.segment =
         (SegmentReader *)
         CONCAT44(local_60.segment._4_4_,
                  *(undefined4 *)((long)local_98.ptr + (ulong)(local_98.step >> 2)));
    kj::_::Debug::log<char_const(&)[71],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x102,ERROR,
               "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",
               (int *)&local_f8,(int *)&local_60);
  }
  if (in_stack_0000002c < 3) {
    local_f8.segment = (SegmentReader *)0x0;
    local_f8.capTable = (CapTableReader *)0x0;
    local_f8.ptr = (byte *)0x0;
    local_f8.elementCount = 0x7fffffff;
  }
  else {
    local_f8.ptr = in_stack_00000020 + 0x10;
    local_f8.segment = in_stack_00000008;
    local_f8.capTable = (CapTableReader *)f.exception;
    local_f8.elementCount = in_stack_00000030;
  }
  index = 0;
  PointerReader::getList(&local_98,(PointerReader *)&local_f8,INLINE_COMPOSITE,(word *)0x0);
  if (local_98.elementCount != 4) {
    local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,4);
    local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,local_98.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())","4 * ELEMENTS, list.size()",
               (uint *)&local_60,(uint *)&local_b8);
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  }
  do {
    ListReader::getStructElement((StructReader *)&local_f8,&local_98,index);
    iVar6 = 0;
    if (0x1f < local_f8.structDataSize) {
      iVar6 = *(int *)local_f8.ptr;
    }
    if ((index + 300 != iVar6) && (kj::_::Debug::minSeverity < 3)) {
      iVar6 = 0;
      local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,index + 300);
      if (0x1f < local_f8.structDataSize) {
        iVar6 = *(int *)local_f8.ptr;
      }
      local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,iVar6);
      kj::_::Debug::log<char_const(&)[76],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x10b,ERROR,
                 "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                 (int *)&local_60,(int *)&local_b8);
    }
    if (local_f8.structPointerCount == 0) {
      local_b8.segment = (SegmentReader *)0x0;
      local_b8.capTable = (CapTableReader *)0x0;
      local_b8.pointer = (WirePointer *)0x0;
      local_b8.nestingLimit = 0x7fffffff;
    }
    else {
      local_b8.pointer = (WirePointer *)CONCAT44(local_f8.step,local_f8.elementCount);
      local_b8.segment = local_f8.segment;
      local_b8.capTable = local_f8.capTable;
      local_b8.nestingLimit = local_f8.nestingLimit;
    }
    PointerReader::getStruct
              (&local_60,&local_b8,
               (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
    uVar5 = 0;
    if (0x1f < local_60.dataSize) {
      uVar5 = *local_60.data;
    }
    if ((index + 400 != uVar5) && (kj::_::Debug::minSeverity < 3)) {
      if (local_f8.structPointerCount == 0) {
        local_b8.segment = (SegmentReader *)0x0;
        local_b8.capTable = (CapTableReader *)0x0;
        local_b8.pointer = (WirePointer *)0x0;
        local_b8.nestingLimit = 0x7fffffff;
      }
      else {
        local_b8.pointer = (WirePointer *)CONCAT44(local_f8.step,local_f8.elementCount);
        local_b8.segment = local_f8.segment;
        local_b8.capTable = local_f8.capTable;
        local_b8.nestingLimit = local_f8.nestingLimit;
      }
      local_bc = index + 400;
      PointerReader::getStruct
                (&local_60,&local_b8,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      local_64 = 0;
      if (0x1f < local_60.dataSize) {
        local_64 = *local_60.data;
      }
      kj::_::Debug::log<char_const(&)[162],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x10f,ERROR,
                 "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [162])
                  "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                 ,(int *)&local_bc,(int *)&local_64);
    }
    index = index + 1;
  } while (index != 4);
  if (in_stack_0000002c < 4) {
    local_f8.segment = (SegmentReader *)0x0;
    local_f8.capTable = (CapTableReader *)0x0;
    local_f8.ptr = (byte *)0x0;
    local_f8.elementCount = 0x7fffffff;
  }
  else {
    local_f8.ptr = in_stack_00000020 + 0x18;
    local_f8.segment = in_stack_00000008;
    local_f8.capTable = (CapTableReader *)f.exception;
    local_f8.elementCount = in_stack_00000030;
  }
  PointerReader::getList(&local_98,(PointerReader *)&local_f8,POINTER,(word *)0x0);
  if (local_98.elementCount != 5) {
    local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,5);
    local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,local_98.elementCount);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())","5 * ELEMENTS, list.size()",
               (uint *)&local_60,(uint *)&local_b8);
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  }
  lVar8 = -1;
  uVar10 = 0;
  do {
    local_60.data = (void *)((local_98.step * uVar10 >> 3) + (long)local_98.ptr);
    local_60.segment = local_98.segment;
    local_60.capTable = local_98.capTable;
    local_60.pointers._0_4_ = local_98.nestingLimit;
    PointerReader::getList(&local_f8,(PointerReader *)&local_60,TWO_BYTES,(word *)0x0);
    uVar10 = uVar10 + 1;
    if (uVar10 != local_f8.elementCount) {
      local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,(int)uVar10);
      local_bc = local_f8.elementCount;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                ((Fault *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
                 "(i + 1) * ELEMENTS, element.size()",(uint *)&local_b8,&local_bc);
      kj::_::Debug::Fault::fatal((Fault *)&local_60);
    }
    uVar9 = 500;
    do {
      uVar7 = (ulong)local_f8.step * (uVar9 - 500) >> 3;
      if ((uVar9 != *(ushort *)(local_f8.ptr + uVar7)) && (kj::_::Debug::minSeverity < 3)) {
        local_60.segment = (SegmentReader *)CONCAT44(local_60.segment._4_4_,(int)uVar9);
        local_b8.segment =
             (SegmentReader *)CONCAT62(local_b8.segment._2_6_,*(undefined2 *)(local_f8.ptr + uVar7))
        ;
        kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x11b,ERROR,
                   "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                   ,(char (*) [80])
                    "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                   ,(uint *)&local_60,(unsigned_short *)&local_b8);
      }
      lVar1 = lVar8 + uVar9;
      uVar9 = uVar9 + 1;
    } while (lVar1 != 499);
    lVar8 = lVar8 + -1;
  } while (uVar10 != 5);
  return;
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}